

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O2

int EVP_DecodeBlock(uchar *t,uchar *f,int n)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *in;
  undefined4 in_register_00000014;
  ulong in_len;
  ulong uVar3;
  ulong uVar4;
  size_t local_20;
  
  puVar1 = f + CONCAT44(in_register_00000014,n);
  uVar3 = CONCAT44(in_register_00000014,n);
  for (; (in = puVar1, uVar3 != 0 && ((*f == ' ' || (in = f, *f == '\t')))); f = f + 1) {
    uVar3 = uVar3 - 1;
  }
  do {
    in_len = uVar3;
    uVar4 = 0xffffffffffffffff;
    if (in_len == 0) goto LAB_003cf0ee;
  } while (((ulong)in[in_len - 1] < 0x21) &&
          (uVar3 = in_len - 1, (0x100002600U >> ((ulong)in[in_len - 1] & 0x3f) & 1) != 0));
  if ((in_len & 3) == 0) {
LAB_003cf0ee:
    local_20 = (in_len >> 2) * 3;
    if ((in_len < 0xaaaaaaa9) &&
       (iVar2 = EVP_DecodeBase64(t,&local_20,local_20,in,in_len), uVar3 = local_20, iVar2 != 0)) {
      for (; (uVar3 / 3) * 3 != uVar3; uVar3 = uVar3 + 1) {
        t[uVar3] = '\0';
      }
      uVar4 = uVar3;
      if (0x7fffffff < uVar3) {
        __assert_fail("dst_len <= INT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                      ,0x1af,"int EVP_DecodeBlock(uint8_t *, const uint8_t *, size_t)");
      }
    }
  }
  return (int)uVar4;
}

Assistant:

int EVP_DecodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  // Trim spaces and tabs from the beginning of the input.
  while (src_len > 0) {
    if (src[0] != ' ' && src[0] != '\t') {
      break;
    }

    src++;
    src_len--;
  }

  // Trim newlines, spaces and tabs from the end of the line.
  while (src_len > 0) {
    switch (src[src_len - 1]) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        src_len--;
        continue;
    }

    break;
  }

  size_t dst_len;
  if (!EVP_DecodedLength(&dst_len, src_len) || dst_len > INT_MAX ||
      !EVP_DecodeBase64(dst, &dst_len, dst_len, src, src_len)) {
    return -1;
  }

  // EVP_DecodeBlock does not take padding into account, so put the
  // NULs back in... so the caller can strip them back out.
  while (dst_len % 3 != 0) {
    dst[dst_len++] = '\0';
  }
  assert(dst_len <= INT_MAX);

  return (int)dst_len;
}